

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error TT_Load_Composite_Glyph(TT_Loader loader)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  FT_GlyphLoader loader_00;
  byte *pbVar5;
  FT_SubGlyph pFVar6;
  FT_Error FVar7;
  FT_Fixed FVar8;
  FT_ULong FVar9;
  int iVar10;
  FT_Fixed FVar11;
  FT_Fixed FVar12;
  FT_SubGlyph unaff_RBX;
  FT_Fixed FVar13;
  uint uVar14;
  FT_UInt FVar15;
  byte *pbVar16;
  byte *pbVar17;
  
  loader_00 = loader->gloader;
  pbVar5 = loader->limit;
  FVar15 = 0;
  pbVar16 = loader->cursor;
  do {
    FVar7 = FT_GlyphLoader_CheckSubGlyphs(loader_00,FVar15 + 1);
    iVar10 = 4;
    pbVar17 = pbVar16;
    if (FVar7 == 0) {
      pbVar1 = pbVar16 + 4;
      iVar10 = 5;
      if (pbVar1 <= pbVar5) {
        pFVar6 = (loader_00->current).subglyphs;
        pFVar6[FVar15].arg1 = 0;
        pFVar6[FVar15].arg2 = 0;
        bVar3 = *pbVar16;
        bVar4 = pbVar16[1];
        pFVar6[FVar15].flags = CONCAT11(bVar3,bVar4);
        pFVar6[FVar15].index =
             (uint)(ushort)(*(ushort *)(pbVar16 + 2) << 8 | *(ushort *)(pbVar16 + 2) >> 8);
        iVar2 = (bVar4 & 1) * 2;
        if ((bVar4 & 8) == 0) {
          if ((bVar4 & 0x40) == 0) {
            uVar14 = iVar2 + 2U | (ushort)(CONCAT11(bVar3,bVar4) >> 4) & 8;
          }
          else {
            uVar14 = iVar2 + 6;
          }
        }
        else {
          uVar14 = iVar2 + 4;
        }
        unaff_RBX = pFVar6 + FVar15;
        pbVar17 = pbVar1;
        if (pbVar1 + uVar14 <= pbVar5) {
          if ((bVar4 & 2) == 0) {
            if ((bVar4 & 1) == 0) {
              unaff_RBX->arg1 = (uint)pbVar16[4];
              uVar14 = (uint)pbVar16[5];
LAB_00231adc:
              pbVar17 = pbVar16 + 6;
            }
            else {
              unaff_RBX->arg1 =
                   (uint)(ushort)(*(ushort *)(pbVar16 + 4) << 8 | *(ushort *)(pbVar16 + 4) >> 8);
              pbVar17 = pbVar16 + 8;
              uVar14 = (uint)(ushort)(*(ushort *)(pbVar16 + 6) << 8 | *(ushort *)(pbVar16 + 6) >> 8)
              ;
            }
          }
          else {
            if ((bVar4 & 1) == 0) {
              unaff_RBX->arg1 = (int)(char)pbVar16[4];
              uVar14 = (uint)(char)pbVar16[5];
              goto LAB_00231adc;
            }
            unaff_RBX->arg1 = (int)(short)((ushort)pbVar16[4] << 8) | (uint)pbVar16[5];
            pbVar17 = pbVar16 + 8;
            uVar14 = (int)(short)((ushort)pbVar16[6] << 8) | (uint)pbVar16[7];
          }
          unaff_RBX->arg2 = uVar14;
          if ((bVar4 & 8) == 0) {
            if ((bVar4 & 0x40) != 0) {
              FVar8 = ((long)(short)((ushort)*pbVar17 << 8) | (ulong)pbVar17[1]) << 2;
              pbVar16 = pbVar17 + 2;
              pbVar1 = pbVar17 + 3;
              pbVar17 = pbVar17 + 4;
              FVar13 = ((long)(short)((ushort)*pbVar16 << 8) | (ulong)*pbVar1) << 2;
              goto LAB_00231ba8;
            }
            if (-1 < (char)bVar4) {
              FVar8 = 0x10000;
              FVar13 = 0x10000;
              goto LAB_00231ba8;
            }
            FVar8 = ((long)(short)((ushort)*pbVar17 << 8) | (ulong)pbVar17[1]) << 2;
            FVar11 = ((long)(short)((ushort)pbVar17[2] << 8) | (ulong)pbVar17[3]) << 2;
            FVar12 = ((long)(short)((ushort)pbVar17[4] << 8) | (ulong)pbVar17[5]) << 2;
            pbVar16 = pbVar17 + 6;
            pbVar1 = pbVar17 + 7;
            pbVar17 = pbVar17 + 8;
            FVar13 = ((long)(short)((ushort)*pbVar16 << 8) | (ulong)*pbVar1) << 2;
          }
          else {
            bVar3 = *pbVar17;
            pbVar16 = pbVar17 + 1;
            pbVar17 = pbVar17 + 2;
            FVar8 = ((long)(short)((ushort)bVar3 << 8) | (ulong)*pbVar16) << 2;
            FVar13 = FVar8;
LAB_00231ba8:
            FVar12 = 0;
            FVar11 = 0;
          }
          (unaff_RBX->transform).xx = FVar8;
          (unaff_RBX->transform).xy = FVar12;
          (unaff_RBX->transform).yx = FVar11;
          (unaff_RBX->transform).yy = FVar13;
          iVar10 = 0;
          FVar15 = FVar15 + 1;
        }
      }
    }
    if (iVar10 != 0) {
      if (iVar10 == 1) {
        return FVar7;
      }
      if (iVar10 == 4) {
        return FVar7;
      }
      return 0x15;
    }
    pbVar16 = pbVar17;
    if ((unaff_RBX->flags & 0x20) == 0) {
      (loader_00->current).num_subglyphs = FVar15;
      FVar9 = FT_Stream_Pos(loader->stream);
      loader->ins_pos = (FT_ULong)(pbVar17 + (FVar9 - (long)pbVar5));
      loader->cursor = pbVar17;
      return FVar7;
    }
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Composite_Glyph( TT_Loader  loader )
  {
    FT_Error        error;
    FT_Byte*        p       = loader->cursor;
    FT_Byte*        limit   = loader->limit;
    FT_GlyphLoader  gloader = loader->gloader;
    FT_SubGlyph     subglyph;
    FT_UInt         num_subglyphs;


    num_subglyphs = 0;

    do
    {
      FT_Fixed  xx, xy, yy, yx;
      FT_UInt   count;


      /* check that we can load a new subglyph */
      error = FT_GlyphLoader_CheckSubGlyphs( gloader, num_subglyphs + 1 );
      if ( error )
        goto Fail;

      /* check space */
      if ( p + 4 > limit )
        goto Invalid_Composite;

      subglyph = gloader->current.subglyphs + num_subglyphs;

      subglyph->arg1 = subglyph->arg2 = 0;

      subglyph->flags = FT_NEXT_USHORT( p );
      subglyph->index = FT_NEXT_USHORT( p );

      /* check space */
      count = 2;
      if ( subglyph->flags & ARGS_ARE_WORDS )
        count += 2;
      if ( subglyph->flags & WE_HAVE_A_SCALE )
        count += 2;
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
        count += 4;
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
        count += 8;

      if ( p + count > limit )
        goto Invalid_Composite;

      /* read arguments */
      if ( subglyph->flags & ARGS_ARE_XY_VALUES )
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = FT_NEXT_SHORT( p );
          subglyph->arg2 = FT_NEXT_SHORT( p );
        }
        else
        {
          subglyph->arg1 = FT_NEXT_CHAR( p );
          subglyph->arg2 = FT_NEXT_CHAR( p );
        }
      }
      else
      {
        if ( subglyph->flags & ARGS_ARE_WORDS )
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_USHORT( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_USHORT( p );
        }
        else
        {
          subglyph->arg1 = (FT_Int)FT_NEXT_BYTE( p );
          subglyph->arg2 = (FT_Int)FT_NEXT_BYTE( p );
        }
      }

      /* read transform */
      xx = yy = 0x10000L;
      xy = yx = 0;

      if ( subglyph->flags & WE_HAVE_A_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = xx;
      }
      else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }
      else if ( subglyph->flags & WE_HAVE_A_2X2 )
      {
        xx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yx = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        xy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
        yy = (FT_Fixed)FT_NEXT_SHORT( p ) * 4;
      }

      subglyph->transform.xx = xx;
      subglyph->transform.xy = xy;
      subglyph->transform.yx = yx;
      subglyph->transform.yy = yy;

      num_subglyphs++;

    } while ( subglyph->flags & MORE_COMPONENTS );

    gloader->current.num_subglyphs = num_subglyphs;
    FT_TRACE5(( "  %d component%s\n",
                num_subglyphs,
                num_subglyphs > 1 ? "s" : "" ));

#ifdef FT_DEBUG_LEVEL_TRACE
    {
      FT_UInt  i;


      subglyph = gloader->current.subglyphs;

      for ( i = 0; i < num_subglyphs; i++ )
      {
        if ( num_subglyphs > 1 )
          FT_TRACE7(( "    subglyph %d:\n", i ));

        FT_TRACE7(( "      glyph index: %d\n", subglyph->index ));

        if ( subglyph->flags & ARGS_ARE_XY_VALUES )
          FT_TRACE7(( "      offset: x=%d, y=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));
        else
          FT_TRACE7(( "      matching points: base=%d, component=%d\n",
                      subglyph->arg1,
                      subglyph->arg2 ));

        if ( subglyph->flags & WE_HAVE_A_SCALE )
          FT_TRACE7(( "      scaling: %f\n",
                      subglyph->transform.xx / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_AN_XY_SCALE )
          FT_TRACE7(( "      scaling: x=%f, y=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yy / 65536.0 ));
        else if ( subglyph->flags & WE_HAVE_A_2X2 )
          FT_TRACE7(( "      scaling: xx=%f, yx=%f\n"
                      "               xy=%f, yy=%f\n",
                      subglyph->transform.xx / 65536.0,
                      subglyph->transform.yx / 65536.0,
                      subglyph->transform.xy / 65536.0,
                      subglyph->transform.yy / 65536.0 ));

        subglyph++;
      }
    }
#endif /* FT_DEBUG_LEVEL_TRACE */

#ifdef TT_USE_BYTECODE_INTERPRETER

    {
      FT_Stream  stream = loader->stream;


      /* we must undo the FT_FRAME_ENTER in order to point */
      /* to the composite instructions, if we find some.   */
      /* We will process them later.                       */
      /*                                                   */
      loader->ins_pos = (FT_ULong)( FT_STREAM_POS() +
                                    p - limit );
    }

#endif

    loader->cursor = p;

  Fail:
    return error;

  Invalid_Composite:
    error = FT_THROW( Invalid_Composite );
    goto Fail;
  }